

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::removeUnneededInstructions
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  size_type sVar1;
  IRContext *pIVar2;
  bool bVar3;
  anon_class_1_0_00000001 local_99;
  function<bool_(spvtools::opt::Instruction_*)> local_98;
  undefined1 local_78 [16];
  uint32_t local_68;
  uint32_t local_64;
  uint32_t local_60;
  anon_class_1_0_00000001 local_59;
  function<bool_(spvtools::opt::Instruction_*)> local_58;
  undefined1 local_38 [16];
  uint32_t local_28;
  uint32_t local_24;
  uint32_t local_20;
  byte local_19;
  BasicBlock *pBStack_18;
  bool modified;
  BasicBlock *block_local;
  InvocationInterlockPlacementPass *this_local;
  
  local_19 = 0;
  pBStack_18 = block;
  block_local = (BasicBlock *)this;
  local_20 = BasicBlock::id(block);
  sVar1 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->predecessors_after_begin_,&local_20);
  bVar3 = false;
  if (sVar1 == 0) {
    local_24 = BasicBlock::id(pBStack_18);
    sVar1 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->after_begin_,&local_24);
    bVar3 = sVar1 != 0;
  }
  if (bVar3) {
    bVar3 = killDuplicateBegin(this,pBStack_18);
    local_19 = (local_19 & 1) != 0 || bVar3;
  }
  else {
    local_28 = BasicBlock::id(pBStack_18);
    sVar1 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->predecessors_after_begin_,&local_28);
    if (sVar1 != 0) {
      pIVar2 = Pass::context(&this->super_Pass);
      BasicBlock::begin((BasicBlock *)(local_38 + 8));
      BasicBlock::end((BasicBlock *)local_38);
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::InvocationInterlockPlacementPass::removeUnneededInstructions(spvtools::opt::BasicBlock*)::__0,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_58,&local_59);
      bVar3 = IRContext::KillInstructionIf
                        (pIVar2,(inst_iterator *)(local_38 + 8),(inst_iterator *)local_38,&local_58)
      ;
      local_19 = (local_19 & 1) != 0 || bVar3;
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_58);
    }
  }
  local_60 = BasicBlock::id(pBStack_18);
  sVar1 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->successors_before_end_,&local_60);
  bVar3 = false;
  if (sVar1 == 0) {
    local_64 = BasicBlock::id(pBStack_18);
    sVar1 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->before_end_,&local_64);
    bVar3 = sVar1 != 0;
  }
  if (bVar3) {
    bVar3 = killDuplicateEnd(this,pBStack_18);
    local_19 = (local_19 & 1) != 0 || bVar3;
  }
  else {
    local_68 = BasicBlock::id(pBStack_18);
    sVar1 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->successors_before_end_,&local_68);
    if (sVar1 != 0) {
      pIVar2 = Pass::context(&this->super_Pass);
      BasicBlock::begin((BasicBlock *)(local_78 + 8));
      BasicBlock::end((BasicBlock *)local_78);
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::InvocationInterlockPlacementPass::removeUnneededInstructions(spvtools::opt::BasicBlock*)::__1,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_98,&local_99);
      bVar3 = IRContext::KillInstructionIf
                        (pIVar2,(inst_iterator *)(local_78 + 8),(inst_iterator *)local_78,&local_98)
      ;
      local_19 = (local_19 & 1) != 0 || bVar3;
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_98);
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool InvocationInterlockPlacementPass::removeUnneededInstructions(
    BasicBlock* block) {
  bool modified = false;
  if (!predecessors_after_begin_.count(block->id()) &&
      after_begin_.count(block->id())) {
    // None of the previous blocks are in the critical section, but this block
    // is. This can only happen if this block already has at least one begin
    // instruction. Leave the first begin instruction, and remove any others.
    modified |= killDuplicateBegin(block);
  } else if (predecessors_after_begin_.count(block->id())) {
    // At least one previous block is in the critical section; remove all
    // begin instructions in this block.
    modified |= context()->KillInstructionIf(
        block->begin(), block->end(), [](Instruction* inst) {
          return inst->opcode() == spv::Op::OpBeginInvocationInterlockEXT;
        });
  }

  if (!successors_before_end_.count(block->id()) &&
      before_end_.count(block->id())) {
    // Same as above
    modified |= killDuplicateEnd(block);
  } else if (successors_before_end_.count(block->id())) {
    modified |= context()->KillInstructionIf(
        block->begin(), block->end(), [](Instruction* inst) {
          return inst->opcode() == spv::Op::OpEndInvocationInterlockEXT;
        });
  }
  return modified;
}